

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recvstate.c
# Opt level: O1

int quicly_recvstate_reset(quicly_recvstate_t *state,uint64_t eos_at,uint64_t *bytes_missing)

{
  quicly_range_t *pqVar1;
  size_t sVar2;
  quicly_range_t *__ptr;
  int iVar3;
  
  sVar2 = (state->received).num_ranges;
  if (sVar2 != 0) {
    iVar3 = 0x20006;
    if (state->eos == 0xffffffffffffffff || state->eos == eos_at) {
      __ptr = (state->received).ranges;
      if (__ptr[sVar2 - 1].end <= eos_at) {
        *bytes_missing = eos_at - __ptr[sVar2 - 1].end;
        pqVar1 = &(state->received)._initial;
        if (__ptr != pqVar1) {
          free(__ptr);
          (state->received).ranges = pqVar1;
        }
        (state->received).num_ranges = 0;
        (state->received).capacity = 1;
        iVar3 = 0;
      }
    }
    return iVar3;
  }
  __assert_fail("!quicly_recvstate_transfer_complete(state)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/recvstate.c"
                ,0x60,"int quicly_recvstate_reset(quicly_recvstate_t *, uint64_t, uint64_t *)");
}

Assistant:

int quicly_recvstate_reset(quicly_recvstate_t *state, uint64_t eos_at, uint64_t *bytes_missing)
{
    assert(!quicly_recvstate_transfer_complete(state));

    /* validate */
    if (state->eos != UINT64_MAX && state->eos != eos_at)
        return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;
    if (eos_at < state->received.ranges[state->received.num_ranges - 1].end)
        return QUICLY_TRANSPORT_ERROR_FINAL_SIZE;

    /* calculate bytes missing */
    *bytes_missing = eos_at - state->received.ranges[state->received.num_ranges - 1].end;

    /* clear the received range */
    quicly_ranges_clear(&state->received);

    return 0;
}